

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atf-test.c
# Opt level: O1

atf_error_t microatf_tp_add_tcs(atf_tp_t *tp)

{
  char cVar1;
  atf_error_t paVar2;
  
  paVar2 = (atf_error_t)microatf_tp_add_tc(tp,&microatf_tc_atf__environment);
  cVar1 = atf_is_error(paVar2);
  if (cVar1 == '\0') {
    paVar2 = (atf_error_t)microatf_tp_add_tc(tp,&microatf_tc_atf__timeout);
    cVar1 = atf_is_error(paVar2);
    if (cVar1 == '\0') {
      paVar2 = (atf_error_t)microatf_tp_add_tc(tp,&microatf_tc_atf__checkfail);
      cVar1 = atf_is_error(paVar2);
      if (cVar1 == '\0') {
        paVar2 = (atf_error_t)microatf_tp_add_tc(tp,&microatf_tc_atf__exit_code);
        cVar1 = atf_is_error(paVar2);
        if (cVar1 == '\0') {
          paVar2 = (atf_error_t)microatf_tp_add_tc(tp,&microatf_tc_atf__signal);
          cVar1 = atf_is_error(paVar2);
          if (cVar1 == '\0') {
            paVar2 = (atf_error_t)atf_no_error();
            return paVar2;
          }
        }
      }
    }
  }
  return paVar2;
}

Assistant:

ATF_TP_ADD_TCS(tp)
{
	ATF_TP_ADD_TC(tp, atf__environment);
	ATF_TP_ADD_TC(tp, atf__timeout);
	ATF_TP_ADD_TC(tp, atf__checkfail);
	ATF_TP_ADD_TC(tp, atf__exit_code);
	ATF_TP_ADD_TC(tp, atf__signal);

	return atf_no_error();
}